

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setSignificantDigitsUsed(DecimalFormat *this,UBool useSignificantDigits)

{
  DecimalFormatProperties *pDVar1;
  uint uVar2;
  int32_t iVar3;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (useSignificantDigits == '\0') {
    uVar2 = 0xffffffff;
    if (pDVar1->minimumSignificantDigits == -1) {
      iVar3 = -1;
      if (pDVar1->maximumSignificantDigits == -1) {
        return;
      }
    }
    else {
      iVar3 = -1;
    }
  }
  else {
    if ((pDVar1->minimumSignificantDigits != -1) || (pDVar1->maximumSignificantDigits != -1)) {
      return;
    }
    iVar3 = 1;
    uVar2 = 6;
  }
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  pDVar1->minimumSignificantDigits = iVar3;
  pDVar1->maximumSignificantDigits = uVar2;
  uStack_8 = (ulong)uVar2;
  touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void DecimalFormat::setSignificantDigitsUsed(UBool useSignificantDigits) {
    // These are the default values from the old implementation.
    if (useSignificantDigits) {
        if (fields->properties->minimumSignificantDigits != -1 ||
            fields->properties->maximumSignificantDigits != -1) {
            return;
        }
    } else {
        if (fields->properties->minimumSignificantDigits == -1 &&
            fields->properties->maximumSignificantDigits == -1) {
            return;
        }
    }
    int32_t minSig = useSignificantDigits ? 1 : -1;
    int32_t maxSig = useSignificantDigits ? 6 : -1;
    fields->properties->minimumSignificantDigits = minSig;
    fields->properties->maximumSignificantDigits = maxSig;
    touchNoError();
}